

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O3

Satellite * __thiscall SatPos::GetPosAndVel(SatPos *this,NavSys flag)

{
  if (flag != GPS) {
    if (flag != BDS) {
      exit(2);
    }
    this = (SatPos *)this->Bds;
  }
  return this->Gps;
}

Assistant:

Satellite* SatPos::GetPosAndVel(NavSys flag)
{
    if(flag == GPS)
        return Gps;
    else if(flag == BDS)
        return Bds;
    else
        exit(2);
}